

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O0

void Res_SimAdjust(Res_Sim_t *p,Abc_Ntk_t *pAig,int nTruePis)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  uint *puVar4;
  int nTruePis_local;
  Abc_Ntk_t *pAig_local;
  Res_Sim_t *p_local;
  
  srand(0xabc);
  iVar1 = Abc_NtkIsStrash(pAig);
  if (iVar1 != 0) {
    p->pAig = pAig;
    p->nTruePis = nTruePis;
    iVar1 = Vec_PtrSize(p->vPats);
    iVar2 = Abc_NtkObjNumMax(pAig);
    if (iVar1 < iVar2 + 1) {
      Vec_PtrFree(p->vPats);
      iVar1 = Abc_NtkObjNumMax(pAig);
      pVVar3 = Vec_PtrAllocSimInfo(iVar1 + 1,p->nWordsIn);
      p->vPats = pVVar3;
    }
    iVar1 = Vec_PtrSize(p->vPats0);
    if (iVar1 < nTruePis) {
      Vec_PtrFree(p->vPats0);
      pVVar3 = Vec_PtrAllocSimInfo(nTruePis,p->nWords);
      p->vPats0 = pVVar3;
    }
    iVar1 = Vec_PtrSize(p->vPats1);
    if (iVar1 < nTruePis) {
      Vec_PtrFree(p->vPats1);
      pVVar3 = Vec_PtrAllocSimInfo(nTruePis,p->nWords);
      p->vPats1 = pVVar3;
    }
    iVar1 = Vec_PtrSize(p->vOuts);
    iVar2 = Abc_NtkPoNum(pAig);
    if (iVar1 < iVar2) {
      Vec_PtrFree(p->vOuts);
      iVar1 = Abc_NtkPoNum(pAig);
      pVVar3 = Vec_PtrAllocSimInfo(iVar1,p->nWordsOut);
      p->vOuts = pVVar3;
    }
    puVar4 = (uint *)Vec_PtrEntry(p->vPats0,0);
    Abc_InfoClear(puVar4,p->nWords * nTruePis);
    puVar4 = (uint *)Vec_PtrEntry(p->vPats1,0);
    Abc_InfoClear(puVar4,p->nWords * nTruePis);
    p->nPats0 = 0;
    p->nPats1 = 0;
    p->fConst0 = 0;
    p->fConst1 = 0;
    return;
  }
  __assert_fail("Abc_NtkIsStrash(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                ,0x54,"void Res_SimAdjust(Res_Sim_t *, Abc_Ntk_t *, int)");
}

Assistant:

void Res_SimAdjust( Res_Sim_t * p, Abc_Ntk_t * pAig, int nTruePis )
{
    srand( 0xABC );

    assert( Abc_NtkIsStrash(pAig) );
    p->pAig = pAig;
    p->nTruePis = nTruePis;
    if ( Vec_PtrSize(p->vPats) < Abc_NtkObjNumMax(pAig)+1 )
    {
        Vec_PtrFree( p->vPats );
        p->vPats = Vec_PtrAllocSimInfo( Abc_NtkObjNumMax(pAig)+1, p->nWordsIn );
    }
    if ( Vec_PtrSize(p->vPats0) < nTruePis )
    {
        Vec_PtrFree( p->vPats0 );
        p->vPats0 = Vec_PtrAllocSimInfo( nTruePis, p->nWords );
    }
    if ( Vec_PtrSize(p->vPats1) < nTruePis )
    {
        Vec_PtrFree( p->vPats1 );
        p->vPats1 = Vec_PtrAllocSimInfo( nTruePis, p->nWords );
    }
    if ( Vec_PtrSize(p->vOuts) < Abc_NtkPoNum(pAig) )
    {
        Vec_PtrFree( p->vOuts );
        p->vOuts = Vec_PtrAllocSimInfo( Abc_NtkPoNum(pAig), p->nWordsOut );
    }
    // clean storage info for patterns
    Abc_InfoClear( (unsigned *)Vec_PtrEntry(p->vPats0,0), p->nWords * nTruePis );
    Abc_InfoClear( (unsigned *)Vec_PtrEntry(p->vPats1,0), p->nWords * nTruePis );
    p->nPats0 = 0;
    p->nPats1 = 0;
    p->fConst0 = 0;
    p->fConst1 = 0;
}